

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateManager.cpp
# Opt level: O0

void __thiscall
TemplateManager::GetTemplates
          (TemplateManager *this,TYPE_ID s,KEY_ID p,TYPE_ID o,unsigned_short scope,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *tripleTmpl)

{
  bool bVar1;
  pointer ppVar2;
  pointer pTVar3;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar4;
  _Self local_e8;
  _Base_ptr local_e0;
  _Self local_d8;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  _Node_iterator_base<unsigned_long,_false> local_c0;
  undefined1 local_b8;
  _Self local_b0;
  _Base_ptr local_a8;
  _Self local_a0;
  _Base_ptr local_98;
  _Self local_80;
  _Base_ptr local_78;
  _Self local_70;
  _Base_ptr local_68;
  undefined1 local_60 [8];
  TripleTemplate tmp;
  iterator it_triple;
  iterator it_templates;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *tripleTmpl_local;
  unsigned_short scope_local;
  TYPE_ID o_local;
  KEY_ID p_local;
  TemplateManager *pTStack_10;
  TYPE_ID s_local;
  TemplateManager *this_local;
  
  p_local._4_4_ = s;
  pTStack_10 = this;
  std::
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
                       *)&it_triple);
  std::_Rb_tree_const_iterator<TripleTemplate>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<TripleTemplate> *)&tmp.objectType);
  TripleTemplate::TripleTemplate((TripleTemplate *)local_60);
  tmp.ID._0_4_ = p_local._4_4_;
  tmp._8_8_ = p;
  tmp.predicateID._0_4_ = o;
  tmp.predicateID._4_2_ = scope;
  if (((p_local._4_4_ == 0xffffffff) || (o == 0xffffffff)) || (p == 0xffffffffffffffff)) {
    local_d0 = (_Base_ptr)
               std::
               map<unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>_>
               ::begin(&this->templates);
    it_triple._M_node = local_d0;
    while( true ) {
      local_d8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>_>
           ::end(&this->templates);
      bVar1 = std::operator!=((_Self *)&it_triple,&local_d8);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
                             *)&it_triple);
      local_e0 = (_Base_ptr)
                 std::
                 set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>::
                 begin(&ppVar2->second);
      tmp._24_8_ = local_e0;
      while( true ) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
                               *)&it_triple);
        local_e8._M_node =
             (_Base_ptr)
             std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>::
             end(&ppVar2->second);
        bVar1 = std::operator!=((_Self *)&tmp.objectType,&local_e8);
        if (!bVar1) break;
        pTVar3 = std::_Rb_tree_const_iterator<TripleTemplate>::operator->
                           ((_Rb_tree_const_iterator<TripleTemplate> *)&tmp.objectType);
        if (((((pTVar3->subjectType == p_local._4_4_) || (p_local._4_4_ == 0xffffffff)) &&
             ((pTVar3 = std::_Rb_tree_const_iterator<TripleTemplate>::operator->
                                  ((_Rb_tree_const_iterator<TripleTemplate> *)&tmp.objectType),
              pTVar3->objectType == o || (o == 0xffffffff)))) &&
            ((pTVar3 = std::_Rb_tree_const_iterator<TripleTemplate>::operator->
                                 ((_Rb_tree_const_iterator<TripleTemplate> *)&tmp.objectType),
             pTVar3->predicateID == p || (p == 0xffffffffffffffff)))) &&
           (pTVar3 = std::_Rb_tree_const_iterator<TripleTemplate>::operator->
                               ((_Rb_tree_const_iterator<TripleTemplate> *)&tmp.objectType),
           pTVar3->scope == scope)) {
          pTVar3 = std::_Rb_tree_const_iterator<TripleTemplate>::operator->
                             ((_Rb_tree_const_iterator<TripleTemplate> *)&tmp.objectType);
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::insert(tripleTmpl,&pTVar3->ID);
        }
        std::_Rb_tree_const_iterator<TripleTemplate>::operator++
                  ((_Rb_tree_const_iterator<TripleTemplate> *)&tmp.objectType,0);
      }
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
                    *)&it_triple,0);
    }
  }
  else if ((scope == 0) && (p_local._4_4_ != 0xffffffff)) {
    local_68 = (_Base_ptr)
               std::
               map<unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>_>
               ::find(&this->templates,(key_type_conflict1 *)((long)&p_local + 4));
    it_triple._M_node = local_68;
    local_70._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>_>
         ::end(&this->templates);
    bVar1 = std::operator!=((_Self *)&it_triple,&local_70);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
                             *)&it_triple);
      local_78 = (_Base_ptr)
                 std::
                 set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>::
                 find(&ppVar2->second,(key_type *)local_60);
      tmp._24_8_ = local_78;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
                             *)&it_triple);
      local_80._M_node =
           (_Base_ptr)
           std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>::end
                     (&ppVar2->second);
      bVar1 = std::operator!=((_Self *)&tmp.objectType,&local_80);
      if (bVar1) {
        pTVar3 = std::_Rb_tree_const_iterator<TripleTemplate>::operator->
                           ((_Rb_tree_const_iterator<TripleTemplate> *)&tmp.objectType);
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::insert(tripleTmpl,&pTVar3->ID);
      }
    }
  }
  else {
    local_98 = (_Base_ptr)
               std::
               map<unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>_>
               ::begin(&this->templates);
    it_triple._M_node = local_98;
    while( true ) {
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>_>
           ::end(&this->templates);
      bVar1 = std::operator!=((_Self *)&it_triple,&local_a0);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
                             *)&it_triple);
      local_a8 = (_Base_ptr)
                 std::
                 set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>::
                 find(&ppVar2->second,(key_type *)local_60);
      tmp._24_8_ = local_a8;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
                             *)&it_triple);
      local_b0._M_node =
           (_Base_ptr)
           std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>::end
                     (&ppVar2->second);
      bVar1 = std::operator!=((_Self *)&tmp.objectType,&local_b0);
      if (bVar1) {
        pTVar3 = std::_Rb_tree_const_iterator<TripleTemplate>::operator->
                           ((_Rb_tree_const_iterator<TripleTemplate> *)&tmp.objectType);
        pVar4 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::insert(tripleTmpl,&pTVar3->ID);
        local_c0._M_cur =
             (__node_type *)pVar4.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
        local_b8 = pVar4.second;
      }
      local_c8 = (_Base_ptr)
                 std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
                 ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>
                               *)&it_triple,0);
    }
  }
  return;
}

Assistant:

void TemplateManager::GetTemplates(TYPE_ID s, KEY_ID p, TYPE_ID o, unsigned short int scope, unordered_set<size_t>* tripleTmpl) {

	map<TYPE_ID, set<TripleTemplate> >::iterator it_templates;
	set<TripleTemplate>::iterator it_triple;

	TripleTemplate tmp;
	tmp.subjectType = s;
	tmp.predicateID = p;
	tmp.objectType = o;
	tmp.scope = scope;

	if (s != (TYPE_ID) -1 and o != (TYPE_ID) -1 and p != (KEY_ID) -1) { //FIXME, this is kinda hack, should find better way for wildcards
		if (scope == 0 and s != (TYPE_ID) -1) {
			it_templates = templates.find(s);
			if (it_templates != templates.end()) {
				it_triple = it_templates->second.find(tmp);
				if (it_triple != it_templates->second.end()) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		} else {
			for (it_templates = templates.begin(); it_templates != templates.end(); it_templates++) {
				it_triple = it_templates->second.find(tmp);
				if (it_triple != it_templates->second.end()) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		}
	} else {
		//FIXME this is a "slow" hack, find a "normal" solution to work with wildcards
//		cerr << "nie jest zle\ts:" << s << "\to: " << o << endl;
		for (it_templates = templates.begin(); it_templates != templates.end(); it_templates++) {
			for (it_triple = it_templates->second.begin(); it_triple != it_templates->second.end(); it_triple++) {
				if ((it_triple->subjectType == s or s == (TYPE_ID) -1) and (it_triple->objectType == o or o == (TYPE_ID) -1) and (it_triple->predicateID == p or p == (KEY_ID) -1)
						and it_triple->scope == scope) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		}

	}

}